

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManExploreCut(Sbd_Man_t *p,int Pivot,int nLeaves,int *pLeaves,int *pnStrs,Sbd_Str_t *Strs,
                     int *pFreeVar)

{
  Vec_Int_t **ppVVar1;
  undefined4 *puVar2;
  sat_solver *psVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  word wVar9;
  ulong uVar10;
  ulong uVar11;
  abctime aVar12;
  abctime aVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  Sbd_Par_t *pSVar25;
  int iVar26;
  int *piVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  Sbd_Str_t *pSVar31;
  ulong uVar32;
  Vec_Int_t *pVVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Vec_Int_t **local_140;
  int pNodesTop [10];
  timespec ts_5;
  int pNodesBot [10];
  int pNodesBot1 [10];
  int pNodesBot2 [10];
  
  clock_gettime(3,(timespec *)pNodesTop);
  if (((Pivot < 0) || (p->vObj2Var->nSize <= Pivot)) || (p->vLutLevs->nSize <= Pivot)) {
LAB_0054538a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar23 = p->vObj2Var->pArray[(uint)Pivot];
  iVar8 = p->vLutLevs->pArray[(uint)Pivot];
  ppVVar1 = &p->vDivSet;
  if (nLeaves < 1) {
    pVVar33 = *ppVVar1;
    pVVar33->nSize = 0;
    uVar20 = 0;
  }
  else {
    uVar29 = (ulong)(uint)nLeaves;
    uVar30 = nLeaves - 1;
    uVar20 = 0;
    do {
      (*ppVVar1)->nSize = 0;
      uVar32 = 0;
      do {
        if (uVar30 != uVar32) {
          uVar19 = pLeaves[uVar32];
          if ((ulong)uVar19 != 0xffffffff) {
            if (((int)uVar19 < 0) || (p->vObj2Var->nSize <= (int)uVar19)) goto LAB_0054538a;
            Vec_IntPush(p->vDivSet,p->vObj2Var->pArray[uVar19]);
          }
        }
        uVar32 = uVar32 + 1;
      } while (uVar29 != uVar32);
      if (nLeaves <= (*ppVVar1)->nSize) {
        __assert_fail("Vec_IntSize(p->vDivSet) < nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x519,
                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                     );
      }
      iVar7 = clock_gettime(3,(timespec *)pNodesTop);
      if (iVar7 < 0) {
        lVar16 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNodesTop._8_8_),8);
        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + pNodesTop._0_8_ * -1000000;
      }
      psVar3 = p->pSat;
      iVar7 = *pFreeVar;
      *pFreeVar = iVar7 + 1;
      wVar9 = Sbd_ManSolve(psVar3,iVar23,iVar7,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
      iVar7 = clock_gettime(3,(timespec *)pNodesTop);
      if (iVar7 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = (long)pNodesTop._8_8_ / 1000 + pNodesTop._0_8_ * 1000000;
      }
      p->timeSat = p->timeSat + lVar17 + lVar16;
      if (wVar9 == 0x8765432187654321) {
        iVar7 = pLeaves[uVar29 + ~uVar20];
        if (((long)iVar7 < 0) || (p->vLutLevs->nSize <= iVar7)) goto LAB_0054538a;
        if (-2 < p->vLutLevs->pArray[iVar7] - iVar8) goto LAB_00545372;
      }
      else if (wVar9 == 0x1234567812345678) {
        printf("Node %d:  Undecided.\n",(ulong)(uint)Pivot);
      }
      else {
        pLeaves[uVar29 + ~uVar20] = -1;
      }
      uVar20 = uVar20 + 1;
      uVar30 = uVar30 - 1;
    } while (uVar20 != uVar29);
    pVVar33 = p->vDivSet;
    pVVar33->nSize = 0;
    if (nLeaves < 1) {
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      do {
        if (pLeaves[uVar20] != -1) {
          Vec_IntPush(p->vDivSet,pLeaves[uVar20]);
        }
        uVar20 = uVar20 + 1;
      } while (uVar29 != uVar20);
      pVVar33 = p->vDivSet;
      uVar20 = (ulong)(uint)pVVar33->nSize;
    }
  }
  local_140 = &p->vDivSet;
  pSVar25 = p->pPars;
  iVar7 = (int)uVar20;
  if (pSVar25->nLutSize < iVar7) {
    if (iVar7 < 1) {
      uVar32 = 0;
      uVar21 = 0;
      iVar8 = 0;
      uVar30 = 0;
      uVar29 = 0;
    }
    else {
      piVar18 = pVVar33->pArray;
      pVVar4 = p->vLutLevs;
      lVar16 = 0;
      uVar29 = 0;
      uVar30 = 0;
      uVar21 = 0;
      uVar32 = 0;
      do {
        iVar7 = (int)uVar20;
        iVar23 = piVar18[lVar16];
        lVar17 = (long)iVar23;
        if ((lVar17 < 0) || (pVVar4->nSize <= iVar23)) goto LAB_0054538a;
        iVar26 = pVVar4->pArray[lVar17] - iVar8;
        if (-2 < iVar26) break;
        if (iVar26 == -2) {
          iVar7 = (int)uVar29;
          uVar29 = (ulong)(iVar7 + 1);
          piVar27 = pNodesTop;
        }
        else {
          lVar15 = (long)(int)uVar30;
          uVar30 = uVar30 + 1;
          pNodesBot[lVar15] = (int)lVar16;
          if (iVar26 == -3) {
            iVar7 = (int)uVar32;
            uVar32 = (ulong)(iVar7 + 1);
            piVar27 = pNodesBot1;
          }
          else {
            iVar7 = (int)uVar21;
            uVar21 = (ulong)(iVar7 + 1);
            piVar27 = pNodesBot2;
          }
        }
        piVar27[iVar7] = (int)lVar16;
        if (p->vObj2Var->nSize <= iVar23) goto LAB_0054538a;
        piVar18[lVar16] = p->vObj2Var->pArray[lVar17];
        lVar16 = lVar16 + 1;
        iVar7 = pVVar33->nSize;
        uVar20 = (ulong)iVar7;
      } while (lVar16 < (long)uVar20);
      iVar8 = (int)lVar16;
    }
    iVar26 = (int)uVar21;
    iVar5 = (int)uVar32;
    if (uVar30 != iVar26 + iVar5) {
      __assert_fail("nNodesBot == nNodesBot1 + nNodesBot2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x55e,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    iVar23 = 0;
    if (iVar7 <= iVar8) {
      uVar19 = pSVar25->nLutSize;
      if ((int)uVar29 < (int)uVar19) {
        uVar24 = uVar30;
        if (iVar7 < (int)(uVar19 * 2)) {
          iVar23 = uVar30 - uVar19;
          if (iVar23 == 0 || (int)uVar30 < (int)uVar19) {
            iVar23 = 0;
          }
          else {
            piVar18 = pNodesBot + (long)(int)uVar30 + -1;
            lVar16 = 0;
            do {
              pNodesTop[(int)uVar29 + lVar16] = *piVar18;
              lVar16 = lVar16 + 1;
              piVar18 = piVar18 + -1;
            } while (iVar23 != (int)lVar16);
            if (iVar23 != (int)lVar16) {
              __assert_fail("nNodesBot == p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x56c,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            uVar29 = uVar29 + lVar16;
            uVar24 = uVar19;
          }
          uVar28 = (uint)uVar29;
          if ((int)uVar19 <= (int)uVar28) {
            __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x56f,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          Strs->fLut = 1;
          Strs->nVarIns = uVar19;
          if ((int)uVar28 < 1) {
            uVar14 = 0;
          }
          else {
            memcpy(Strs->VarIns,pNodesTop,(uVar29 & 0xffffffff) << 2);
            uVar19 = pSVar25->nLutSize;
            uVar14 = uVar28;
          }
          if ((int)uVar14 < (int)uVar19) {
            uVar20 = (ulong)uVar14;
            do {
              Strs->VarIns[uVar20] = (1 - uVar28) + (int)uVar20 + pVVar33->nSize;
              uVar20 = uVar20 + 1;
              uVar19 = pSVar25->nLutSize;
            } while ((int)uVar20 < (int)uVar19);
          }
          Strs->Res = 0;
          Strs[1].fLut = 1;
          Strs[1].nVarIns = uVar24;
          if (0 < (int)uVar24) {
            memcpy(Strs[1].VarIns,pNodesBot,(ulong)uVar24 * 4);
            uVar19 = pSVar25->nLutSize;
          }
          Strs[1].Res = 0;
          uVar19 = ~uVar28 + uVar19;
          if (3 < uVar19) {
            __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x580,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          if (uVar19 != 0) {
            lVar16 = 0;
            do {
              *(undefined4 *)((long)Strs[2].VarIns + lVar16 + -8) = 0;
              *(uint *)((long)Strs[2].VarIns + lVar16 + -4) = uVar24;
              if (0 < (int)uVar24) {
                memcpy((void *)((long)Strs[2].VarIns + lVar16),pNodesBot,(ulong)uVar24 << 2);
              }
              *(undefined8 *)((long)Strs[2].VarIns + lVar16 + 0x28) = 0;
              lVar16 = lVar16 + 0x38;
            } while ((ulong)uVar19 * 0x38 - lVar16 != 0);
          }
          *pnStrs = uVar19 + 2;
          iVar8 = clock_gettime(3,(timespec *)&ts_5);
          if (iVar8 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_5.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts_5.tv_sec * -1000000;
          }
          iVar8 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                   p->vRoots,p->vDivSet,*pnStrs,Strs);
          iVar7 = clock_gettime(3,(timespec *)&ts_5);
          if (iVar7 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = ts_5.tv_nsec / 1000 + ts_5.tv_sec * 1000000;
          }
          p->timeQbf = p->timeQbf + lVar17 + lVar16;
          if (iVar8 != 0) {
            p->nLuts[2] = p->nLuts[2] + 1;
          }
          if (iVar23 != 0) {
            piVar18 = pNodesTop + (long)(int)uVar28 + -1;
            lVar16 = 0;
            do {
              pNodesBot[(int)uVar24 + lVar16] = *piVar18;
              lVar16 = lVar16 + 1;
              piVar18 = piVar18 + -1;
              iVar7 = (int)lVar16;
            } while (iVar23 != iVar7);
            uVar24 = uVar24 + iVar7;
            uVar29 = (ulong)(uVar28 - iVar7);
          }
          if (iVar8 != 0) {
            return iVar8;
          }
          pSVar25 = p->pPars;
        }
        iVar23 = 0;
        if (2 < pSVar25->nLutNum) {
          pVVar33 = *local_140;
          iVar8 = pSVar25->nLutSize;
          uVar22 = (ulong)iVar8;
          uVar20 = uVar22 * 2;
          uVar19 = (uint)uVar20;
          if ((int)(uVar19 - 1) <= pVVar33->nSize) {
            if ((int)uVar29 <= iVar8 + -2) {
              iVar23 = uVar24 - uVar19;
              if (iVar23 == 0 || (int)uVar24 < (int)uVar19) {
                iVar23 = 0;
                uVar28 = uVar24;
              }
              else {
                piVar18 = pNodesBot + (long)(int)uVar24 + -1;
                lVar16 = 0;
                do {
                  pNodesTop[(int)uVar29 + lVar16] = *piVar18;
                  lVar16 = lVar16 + 1;
                  piVar18 = piVar18 + -1;
                } while (iVar23 != (int)lVar16);
                if (iVar23 != (int)lVar16) {
                  __assert_fail("nNodesBot == 2*p->pPars->nLutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5a4,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                uVar29 = (uVar29 & 0xffffffff) + lVar16;
                uVar28 = uVar19;
              }
              if ((int)uVar28 <= iVar8) {
                __assert_fail("nNodesBot > p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a6,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              if ((int)uVar19 < (int)uVar28) {
                __assert_fail("nNodesBot <= 2*p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a7,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              uVar19 = (uint)uVar29;
              if (iVar8 + -2 < (int)uVar19) {
                __assert_fail("nNodesTop <= p->pPars->nLutSize-2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a8,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              Strs->fLut = 1;
              Strs->nVarIns = iVar8;
              if ((int)uVar19 < 1) {
                uVar14 = 0;
                uVar11 = uVar22;
              }
              else {
                memcpy(Strs->VarIns,pNodesTop,(uVar29 & 0xffffffff) << 2);
                uVar11 = (ulong)(uint)pSVar25->nLutSize;
                uVar14 = uVar19;
              }
              if ((int)uVar14 < (int)uVar11) {
                uVar10 = (ulong)uVar14;
                do {
                  Strs->VarIns[uVar10] = (1 - uVar19) + (int)uVar10 + pVVar33->nSize;
                  uVar10 = uVar10 + 1;
                  uVar11 = (ulong)(uint)pSVar25->nLutSize;
                } while ((int)uVar10 < pSVar25->nLutSize);
              }
              Strs->Res = 0;
              Strs[1].fLut = 1;
              iVar8 = (int)uVar11;
              Strs[1].nVarIns = iVar8;
              if (iVar8 < 1) {
                Strs[1].Res = 0;
                Strs[2].fLut = 1;
                Strs[2].nVarIns = iVar8;
              }
              else {
                memcpy(Strs[1].VarIns,pNodesBot,(uVar11 & 0xffffffff) << 2);
                iVar8 = pSVar25->nLutSize;
                Strs[1].Res = 0;
                Strs[2].fLut = 1;
                Strs[2].nVarIns = iVar8;
                if (0 < (long)iVar8) {
                  uVar11 = (ulong)(int)uVar24;
                  if (SBORROW8(uVar11,uVar20) != (long)(uVar11 + uVar22 * -2) < 0) {
                    uVar20 = uVar11;
                  }
                  lVar16 = 0;
                  do {
                    Strs[2].VarIns[lVar16] =
                         pNodesBot[((int)uVar20 + (int)lVar16) - pSVar25->nLutSize];
                    lVar16 = lVar16 + 1;
                  } while (iVar8 != lVar16);
                  iVar8 = pSVar25->nLutSize;
                }
              }
              Strs[2].Res = 0;
              uVar24 = (iVar8 - uVar19) - 2;
              if (2 < uVar24) {
                __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5bf,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              if (uVar24 != 0) {
                lVar16 = 0;
                do {
                  puVar2 = (undefined4 *)((long)Strs[3].VarIns + lVar16 + -8);
                  *puVar2 = 0;
                  puVar2[1] = uVar28;
                  memcpy(puVar2 + 2,pNodesBot,(ulong)uVar28 << 2);
                  *(undefined8 *)(puVar2 + 0xc) = 0;
                  lVar16 = lVar16 + 0x38;
                } while ((ulong)uVar24 * 0x38 - lVar16 != 0);
              }
              *pnStrs = (iVar8 - uVar19) + 1;
              aVar12 = Abc_Clock();
              iVar8 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                       p->vRoots,p->vDivSet,*pnStrs,Strs);
              aVar13 = Abc_Clock();
              p->timeQbf = p->timeQbf + (aVar13 - aVar12);
              if (iVar8 != 0) {
                p->nLuts[3] = p->nLuts[3] + 1;
              }
              if (iVar23 != 0) {
                piVar18 = pNodesTop + (long)(int)uVar19 + -1;
                lVar16 = 0;
                do {
                  pNodesBot[(int)uVar28 + lVar16] = *piVar18;
                  lVar16 = lVar16 + 1;
                  piVar18 = piVar18 + -1;
                } while (iVar23 != (int)lVar16);
                uVar29 = (ulong)(uVar19 - (int)lVar16);
              }
              if (iVar8 != 0) {
                return iVar8;
              }
              pSVar25 = p->pPars;
              uVar22 = (ulong)(uint)pSVar25->nLutSize;
              uVar20 = (ulong)(uint)(pSVar25->nLutSize * 2);
            }
            iVar23 = 0;
            if ((int)uVar29 + iVar5 <= (int)uVar20 + -2) {
              iVar23 = (int)uVar22;
              if (iVar23 < iVar26) {
                uVar32 = (ulong)(uVar30 - iVar23);
                piVar18 = pNodesBot2 + (long)iVar26 + -1;
                lVar16 = 0;
                do {
                  pNodesBot1[iVar5 + lVar16] = *piVar18;
                  lVar16 = lVar16 + 1;
                  piVar18 = piVar18 + -1;
                } while ((uVar30 - iVar5) - iVar23 != (int)lVar16);
                uVar21 = uVar22 & 0xffffffff;
                if (iVar26 - iVar23 != (int)lVar16) {
                  __assert_fail("nNodesBot2 == p->pPars->nLutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5dd,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
              }
              iVar8 = (int)uVar32;
              if (iVar23 <= iVar8) {
                lVar17 = (long)iVar8 + 1;
                lVar16 = 0;
                do {
                  pNodesTop[(int)uVar29 + lVar16] = pNodesBot1[lVar17 + -2];
                  lVar16 = lVar16 + 1;
                  lVar17 = lVar17 + -1;
                } while (iVar23 < lVar17);
                if ((iVar8 - iVar23) + 1 != (int)lVar16) {
                  __assert_fail("nNodesBot1 == p->pPars->nLutSize-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5e3,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                uVar32 = uVar32 - lVar16;
                uVar29 = (uVar29 & 0xffffffff) + lVar16;
              }
              iVar8 = (int)uVar21;
              if (iVar23 < iVar8) {
                __assert_fail("nNodesBot2 <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5e5,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              uVar30 = (uint)uVar32;
              if (iVar23 <= (int)uVar30) {
                __assert_fail("nNodesBot1 <= p->pPars->nLutSize-1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5e6,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              uVar19 = (uint)uVar29;
              if (iVar23 <= (int)uVar19) {
                __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5e7,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              Strs->fLut = 1;
              Strs->nVarIns = iVar23;
              if ((int)uVar19 < 1) {
                uVar29 = 0;
              }
              else {
                memcpy(Strs->VarIns,pNodesTop,(uVar29 & 0xffffffff) << 2);
                uVar29 = uVar29 & 0xffffffff;
              }
              pVVar33 = *local_140;
              Strs->VarIns[uVar29] = pVVar33->nSize + 1;
              iVar23 = pSVar25->nLutSize;
              if ((int)uVar29 + 1 < iVar23) {
                do {
                  iVar7 = (int)uVar29;
                  Strs->VarIns[uVar29 + 1] = (3 - uVar19) + iVar7 + pVVar33->nSize;
                  iVar23 = pSVar25->nLutSize;
                  uVar29 = uVar29 + 1;
                } while (iVar7 + 2 < iVar23);
              }
              Strs->Res = 0;
              Strs[1].fLut = 1;
              Strs[1].nVarIns = iVar23;
              if ((int)uVar30 < 1) {
                uVar20 = 0;
              }
              else {
                memcpy(Strs[1].VarIns,pNodesBot1,(uVar32 & 0xffffffff) * 4);
                uVar20 = uVar32 & 0xffffffff;
              }
              Strs[1].VarIns[uVar20] = pVVar33->nSize + 2;
              iVar7 = pSVar25->nLutSize;
              if ((int)uVar20 + 1 < iVar7) {
                iVar26 = (((iVar23 + (int)uVar20) - uVar19) - uVar30) + 2;
                do {
                  Strs[1].VarIns[uVar20 + 1] = pVVar33->nSize + iVar26;
                  iVar7 = pSVar25->nLutSize;
                  iVar26 = iVar26 + 1;
                  iVar5 = (int)uVar20;
                  uVar20 = uVar20 + 1;
                } while (iVar5 + 2 < iVar7);
              }
              Strs[1].Res = 0;
              Strs[2].fLut = 1;
              Strs[2].nVarIns = iVar8;
              if (0 < iVar8) {
                memcpy(Strs[2].VarIns,pNodesBot2,uVar21 * 4);
              }
              Strs[2].Res = 0;
              uVar24 = ~uVar30 + iVar23 + ~uVar19 + iVar7;
              if (3 < uVar24) {
                __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x604,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              if (uVar24 != 0) {
                pSVar31 = Strs + 3;
                uVar20 = 0;
                do {
                  pSVar31->fLut = 0;
                  pSVar31->nVarIns = iVar8;
                  if (0 < iVar8) {
                    memcpy(pSVar31->VarIns,pNodesBot2,uVar21 << 2);
                  }
                  pSVar31->Res = 0;
                  if (((long)uVar20 < (long)(int)(iVar23 + ~uVar19)) &&
                     (pSVar31->nVarIns = uVar30 + iVar8, 0 < (int)uVar30)) {
                    memcpy(pSVar31->VarIns + iVar8,pNodesBot1,(uVar32 & 0xffffffff) << 2);
                  }
                  uVar20 = uVar20 + 1;
                  pSVar31 = pSVar31 + 1;
                } while (uVar20 < uVar24);
              }
              *pnStrs = uVar24 + 3;
              aVar12 = Abc_Clock();
              iVar23 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                        p->vRoots,p->vDivSet,*pnStrs,Strs);
              aVar13 = Abc_Clock();
              p->timeQbf = p->timeQbf + (aVar13 - aVar12);
              if (iVar23 == 0) {
LAB_00545372:
                iVar23 = 0;
              }
              else {
                p->nLuts[4] = p->nLuts[4] + 1;
              }
            }
          }
        }
      }
    }
  }
  else {
    *pnStrs = 1;
    if (0 < pVVar33->nSize) {
      piVar18 = pVVar33->pArray;
      pVVar4 = p->vObj2Var;
      lVar16 = 0;
      do {
        iVar8 = piVar18[lVar16];
        if (((long)iVar8 < 0) || (pVVar4->nSize <= iVar8)) goto LAB_0054538a;
        piVar18[lVar16] = pVVar4->pArray[iVar8];
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar33->nSize);
    }
    iVar8 = clock_gettime(3,(timespec *)pNodesTop);
    if (iVar8 < 0) {
      lVar16 = 1;
    }
    else {
      lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNodesTop._8_8_),8);
      lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + pNodesTop._0_8_ * -1000000;
    }
    psVar3 = p->pSat;
    iVar8 = *pFreeVar;
    *pFreeVar = iVar8 + 1;
    wVar9 = Sbd_ManSolve(psVar3,iVar23,iVar8,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
    iVar23 = clock_gettime(3,(timespec *)pNodesTop);
    if (iVar23 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = (long)pNodesTop._8_8_ / 1000 + pNodesTop._0_8_ * 1000000;
    }
    p->timeSat = p->timeSat + lVar17 + lVar16;
    if (wVar9 == 0x8765432187654321) {
      iVar23 = 0;
      printf("The cut at node %d is not topological.\n",(ulong)(uint)p->Pivot);
    }
    else {
      if (wVar9 == 0x1234567812345678) {
        __assert_fail("Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x53e,
                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                     );
      }
      Strs->fLut = 1;
      iVar23 = (*local_140)->nSize;
      Strs->nVarIns = iVar23;
      auVar6 = _DAT_0094e250;
      if (0 < (long)iVar23) {
        lVar16 = (long)iVar23 + -1;
        auVar34._8_4_ = (int)lVar16;
        auVar34._0_8_ = lVar16;
        auVar34._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar20 = 0;
        auVar34 = auVar34 ^ _DAT_0094e250;
        auVar35 = _DAT_0094e240;
        do {
          auVar36 = auVar35 ^ auVar6;
          if ((bool)(~(auVar36._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar36._0_4_ ||
                      auVar34._4_4_ < auVar36._4_4_) & 1)) {
            Strs->VarIns[uVar20] = (int)uVar20;
          }
          if ((auVar36._12_4_ != auVar34._12_4_ || auVar36._8_4_ <= auVar34._8_4_) &&
              auVar36._12_4_ <= auVar34._12_4_) {
            Strs->VarIns[uVar20 + 1] = (int)uVar20 + 1;
          }
          uVar20 = uVar20 + 2;
          lVar16 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 2;
          auVar35._8_8_ = lVar16 + 2;
        } while ((iVar23 + 1U & 0xfffffffe) != uVar20);
      }
      Strs->Res = wVar9;
      p->nLuts[1] = p->nLuts[1] + 1;
      iVar23 = 1;
    }
  }
  return iVar23;
}

Assistant:

int Sbd_ManExploreCut( Sbd_Man_t * p, int Pivot, int nLeaves, int * pLeaves, int * pnStrs, Sbd_Str_t * Strs, int * pFreeVar )
{
    abctime clk = Abc_Clock();
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int Delay = Vec_IntEntry( p->vLutLevs, Pivot );
    int pNodesTop[SBD_DIV_MAX], pNodesBot[SBD_DIV_MAX], pNodesBot1[SBD_DIV_MAX], pNodesBot2[SBD_DIV_MAX];
    int nNodesTop = 0, nNodesBot = 0, nNodesBot1 = 0, nNodesBot2 = 0, nNodesDiff = 0, nNodesDiff1 = 0, nNodesDiff2 = 0;
    int i, k, iObj, nIters, RetValue = 0;

    // try to remove fanins
    for ( nIters = 0; nIters < nLeaves; nIters++ )
    {
        word Truth;
        // try to remove one variable from divisors
        Vec_IntClear( p->vDivSet );
        for ( i = 0; i < nLeaves; i++ )
            if ( i != nLeaves-1-nIters && pLeaves[i] != -1 )
                Vec_IntPush( p->vDivSet, Vec_IntEntry(p->vObj2Var, pLeaves[i]) );
        assert( Vec_IntSize(p->vDivSet) < nLeaves );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( Truth == SBD_SAT_SAT )
        {
            int DelayDiff = Vec_IntEntry(p->vLutLevs, pLeaves[nLeaves-1-nIters]) - Delay;
            if ( DelayDiff > -2 )
                return 0;
        }
        else
            pLeaves[nLeaves-1-nIters] = -1;
    }
    Vec_IntClear( p->vDivSet );
    for ( i = 0; i < nLeaves; i++ )
        if ( pLeaves[i] != -1 )
            Vec_IntPush( p->vDivSet, pLeaves[i] );
    //printf( "Reduced %d -> %d\n", nLeaves, Vec_IntSize(p->vDivSet) );
    if ( Vec_IntSize(p->vDivSet) <= p->pPars->nLutSize )
    {
        word Truth;
        *pnStrs = 1;
        // remap divisors
        Vec_IntForEachEntry( p->vDivSet, iObj, i )
            Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_SAT )
        {
            printf( "The cut at node %d is not topological.\n", p->Pivot );
            return 0;
        }
        assert( Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT );
        // create structure
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        p->nLuts[1]++;
        //Extra_PrintBinary( stdout, (unsigned *)&Truth, 1 << Strs->nVarIns ), printf( "\n" );
        return 1;
    }
    assert( Vec_IntSize(p->vDivSet) > p->pPars->nLutSize );

    // count number of nodes on each level
    nNodesTop = nNodesBot = nNodesBot1 = nNodesBot2 = 0;
    Vec_IntForEachEntry( p->vDivSet, iObj, i )
    {
        int DelayDiff = Vec_IntEntry(p->vLutLevs, iObj) - Delay;
        if ( DelayDiff > -2 )
            break;
        if ( DelayDiff == -2 )
            pNodesTop[nNodesTop++] = i;
        else // if ( DelayDiff < -2 )
        {
            pNodesBot[nNodesBot++] = i;
            if ( DelayDiff == -3 )
                pNodesBot1[nNodesBot1++] = i;
            else // if ( DelayDiff < -3 )
                pNodesBot2[nNodesBot2++] = i;
        }
        Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
    }
    assert( nNodesBot == nNodesBot1 + nNodesBot2 );
    if ( i < Vec_IntSize(p->vDivSet) )
        return 0;
    if ( nNodesTop > p->pPars->nLutSize-1 )
        return 0;

    // try 44
    if ( Vec_IntSize(p->vDivSet) <= 2*p->pPars->nLutSize-1 )
    {
        int nMoved = 0;
        if ( nNodesBot > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == p->pPars->nLutSize );
        }
        assert( nNodesBot <= p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = nNodesBot;
        for ( i = 0; i < nNodesBot; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        nNodesDiff = p->pPars->nLutSize-1 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[2+k].fLut = 0;
            Strs[2+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[2+k].VarIns[i] = pNodesBot[i];
            Strs[2+k].Res = 0;
        }

        *pnStrs = 2 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[2]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }

    if ( RetValue )
        return RetValue;
    if ( p->pPars->nLutNum < 3 )
        return 0;
    if ( Vec_IntSize(p->vDivSet) < 2*p->pPars->nLutSize-1 )
        return 0;

    // try 444 -- LUT(LUT, LUT)
    if ( nNodesTop <= p->pPars->nLutSize-2 )
    {
        int nMoved = 0;
        if ( nNodesBot > 2*p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > 2*p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == 2*p->pPars->nLutSize );
        }
        assert( nNodesBot > p->pPars->nLutSize );
        assert( nNodesBot <= 2*p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-2 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[1].nVarIns; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot[nNodesBot-p->pPars->nLutSize+i];
        Strs[2].Res = 0;

        nNodesDiff = p->pPars->nLutSize-2 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 2 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[3+k].VarIns[i] = pNodesBot[i];
            Strs[3+k].Res = 0;
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[3]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }
    if ( RetValue )
        return RetValue;

    // try 444 -- LUT(LUT(LUT))
    if ( nNodesBot1 + nNodesTop <= 2*p->pPars->nLutSize-2 )
    {
        if ( nNodesBot2 > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot2 > p->pPars->nLutSize )
                pNodesBot1[nNodesBot1++] = pNodesBot2[--nNodesBot2];
            assert( nNodesBot2 == p->pPars->nLutSize );
        }
        if ( nNodesBot1 > p->pPars->nLutSize-1 ) // need to move bottom left-over to the top
        {
            while ( nNodesBot1 > p->pPars->nLutSize-1 )
                pNodesTop[nNodesTop++] = pNodesBot1[--nNodesBot1];
            assert( nNodesBot1 == p->pPars->nLutSize-1 );
        }
        assert( nNodesBot2 <= p->pPars->nLutSize );
        assert( nNodesBot1 <= p->pPars->nLutSize-1 );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        Strs[0].VarIns[i++] = Vec_IntSize(p->vDivSet)+1;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+2 + i-nNodesTop;
        Strs[0].Res = 0;
        nNodesDiff1 = p->pPars->nLutSize-1 - nNodesTop;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesBot1; i++ )
            Strs[1].VarIns[i] = pNodesBot1[i];
        Strs[1].VarIns[i++] = Vec_IntSize(p->vDivSet)+2;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[1].VarIns[i] = Vec_IntSize(p->vDivSet)+2+nNodesDiff1 + i-nNodesBot1;
        Strs[1].Res = 0;
        nNodesDiff2 = p->pPars->nLutSize-1 - nNodesBot1;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = nNodesBot2;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot2[i];
        Strs[2].Res = 0;

        nNodesDiff = nNodesDiff1 + nNodesDiff2;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot2;
            for ( i = 0; i < nNodesBot2; i++ )
                Strs[3+k].VarIns[i] = pNodesBot2[i];
            Strs[3+k].Res = 0;
            if ( k >= nNodesDiff1 )
                continue;
            Strs[3+k].nVarIns += nNodesBot1;
            for ( i = 0; i < nNodesBot1; i++ )
                Strs[3+k].VarIns[nNodesBot2 + i] = pNodesBot1[i];
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[4]++;
    }
    return RetValue;
}